

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::AssignmentPatternExpressionSyntax::getChild
          (AssignmentPatternExpressionSyntax *this,size_t index)

{
  long in_RDX;
  TokenOrSyntax *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  TokenOrSyntax *pTVar1;
  
  if (in_RDX == 0) {
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RDX == 1) {
    pTVar1 = in_RDI;
    not_null<slang::syntax::AssignmentPatternSyntax_*>::get
              ((not_null<slang::syntax::AssignmentPatternSyntax_*> *)
               ((long)&in_RSI[1].super_ConstTokenOrSyntax.
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + 8));
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI = pTVar1;
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax AssignmentPatternExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return type;
        case 1: return pattern.get();
        default: return nullptr;
    }
}